

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O3

char * mtar_strerror(int err)

{
  if (err + 10U < 0xb) {
    return &DAT_00102124 + *(int *)(&DAT_00102124 + (ulong)(err + 10U) * 4);
  }
  return "unknown error";
}

Assistant:

const char* mtar_strerror(int err) {
  switch (err) {
    case MTAR_ESUCCESS     : return "success";
    case MTAR_EFAILURE     : return "failure";
    case MTAR_EOPENFAIL    : return "could not open";
    case MTAR_EREADFAIL    : return "could not read";
    case MTAR_EWRITEFAIL   : return "could not write";
    case MTAR_ESEEKFAIL    : return "could not seek";
    case MTAR_EBADCHKSUM   : return "bad checksum";
    case MTAR_ENULLRECORD  : return "null record";
    case MTAR_ENOTFOUND    : return "file not found";
    case MTAR_ENAMELONG    : return "name too long";
    case MTAR_ETOOLARGE    : return "file too large";
  }
  return "unknown error";
}